

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O3

void amrex::average_face_to_cellcenter(MultiFab *cc,Array<const_MultiFab_*,_3> *fc,Geometry *geom)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  Box bx;
  MFIter mfi;
  Box local_1ac;
  Array4<double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)cc,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::tilebox(&local_1ac,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_190,&cc->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,&fc->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&fc->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,&fc->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&local_90);
      if (local_1ac.smallend.vect[2] <= local_1ac.bigend.vect[2]) {
        lVar5 = (long)local_1ac.smallend.vect[0] * 8;
        iVar10 = local_1ac.smallend.vect[2];
        do {
          if (local_1ac.smallend.vect[1] <= local_1ac.bigend.vect[1]) {
            lVar4 = (long)local_190.begin.x;
            lVar6 = (iVar10 - local_190.begin.z) * local_190.kstride;
            lVar2 = (iVar10 - local_110.begin.z) * local_110.kstride * 8 +
                    (long)local_110.begin.x * -8 + lVar5;
            lVar8 = (long)local_1ac.smallend.vect[1];
            do {
              iVar1 = (int)lVar8;
              if (local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) {
                lVar3 = (lVar8 - local_d0.begin.y) * local_d0.jstride * 8 +
                        (iVar10 - local_d0.begin.z) * local_d0.kstride * 8 +
                        (long)local_d0.begin.x * -8 + lVar5;
                lVar11 = (lVar8 - local_190.begin.y) * local_190.jstride * 8;
                lVar7 = (lVar8 - local_150.begin.y) * local_150.jstride * 8;
                lVar9 = 0;
                do {
                  *(double *)
                   ((long)local_190.p + lVar9 * 8 + lVar11 + lVar6 * 8 + lVar4 * -8 + lVar5) =
                       (*(double *)((long)local_d0.p + lVar9 * 8 + lVar3) +
                       *(double *)((long)local_d0.p + lVar9 * 8 + lVar3 + 8)) * 0.5;
                  *(double *)
                   ((long)local_190.p +
                   lVar9 * 8 + lVar11 + local_190.nstride * 8 + lVar6 * 8 + lVar4 * -8 + lVar5) =
                       (*(double *)
                         ((long)local_110.p +
                         lVar9 * 8 + (lVar8 - local_110.begin.y) * local_110.jstride * 8 + lVar2) +
                       *(double *)
                        ((long)local_110.p +
                        lVar9 * 8 +
                        (long)((iVar1 + 1) - local_110.begin.y) * local_110.jstride * 8 + lVar2)) *
                       0.5;
                  *(double *)
                   ((long)local_190.p +
                   lVar9 * 8 + lVar11 + local_190.nstride * 0x10 + lVar6 * 8 + lVar4 * -8 + lVar5) =
                       (*(double *)
                         ((long)local_150.p +
                         lVar9 * 8 +
                         lVar7 + local_150.kstride * 8 * (long)(iVar10 - local_150.begin.z) +
                                 (long)local_150.begin.x * -8 + lVar5) +
                       *(double *)
                        ((long)local_150.p +
                        lVar9 * 8 +
                        lVar7 + (long)((iVar10 + 1) - local_150.begin.z) * local_150.kstride * 8 +
                                (long)local_150.begin.x * -8 + lVar5)) * 0.5;
                  lVar9 = lVar9 + 1;
                } while ((local_1ac.bigend.vect[0] - local_1ac.smallend.vect[0]) + 1 != (int)lVar9);
              }
              lVar8 = lVar8 + 1;
            } while (iVar1 + 1 != local_1ac.bigend.vect[1] + 1);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 != local_1ac.bigend.vect[2] + 1);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void average_face_to_cellcenter (MultiFab& cc,
                                     const Array<const MultiFab*,AMREX_SPACEDIM>& fc,
                                     const Geometry& geom)
    {
        AMREX_ASSERT(cc.nComp() >= AMREX_SPACEDIM);
        AMREX_ASSERT(fc[0]->nComp() == 1); // We only expect fc to have the gradient perpendicular to the face

        const GeometryData gd = geom.data();
        amrex::ignore_unused(gd);

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.arrays();
            AMREX_D_TERM(auto const& fxma = fc[0]->const_arrays();,
                         auto const& fyma = fc[1]->const_arrays();,
                         auto const& fzma = fc[2]->const_arrays(););
            ParallelFor(cc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                amrex_avg_fc_to_cc(i,j,k, ccma[box_no], AMREX_D_DECL(fxma[box_no],
                                                                     fyma[box_no],
                                                                     fzma[box_no]),
                                   0
#if (AMREX_SPACEDIM == 1)
                                   , gd
#endif
                                   );
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box bx = mfi.tilebox();
                Array4<Real> const& ccarr = cc.array(mfi);
                AMREX_D_TERM(Array4<Real const> const& fxarr = fc[0]->const_array(mfi);,
                             Array4<Real const> const& fyarr = fc[1]->const_array(mfi);,
                             Array4<Real const> const& fzarr = fc[2]->const_array(mfi););

#if (AMREX_SPACEDIM == 1)
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D( bx, i, j, k,
                {
                    amrex_avg_fc_to_cc(i,j,k, ccarr, fxarr, 0, gd);
                });
#else
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D( bx, i, j, k,
                {
                    amrex_avg_fc_to_cc(i,j,k, ccarr, AMREX_D_DECL(fxarr,fyarr,fzarr), 0);
                });
#endif
            }
        }
    }